

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O3

bool __thiscall
cmBinUtilsMacOSMachOLinker::ResolveLoaderPathDependency
          (cmBinUtilsMacOSMachOLinker *this,string *name,string *loaderPath,string *path,
          bool *resolved)

{
  bool bVar1;
  
  if (loaderPath->_M_string_length == 0) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::_M_assign((string *)path);
    std::__cxx11::string::replace((ulong)path,0,&DAT_0000000c,(ulong)(loaderPath->_M_dataplus)._M_p)
    ;
    bVar1 = cmsys::SystemTools::PathExists(path);
  }
  *resolved = bVar1;
  return true;
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::ResolveLoaderPathDependency(
  std::string const& name, std::string const& loaderPath, std::string& path,
  bool& resolved)
{
  if (loaderPath.empty()) {
    resolved = false;
    return true;
  }

  // 12 is "@loader_path".length();
  path = name;
  path.replace(0, 12, loaderPath);

  if (!cmSystemTools::PathExists(path)) {
    resolved = false;
    return true;
  }

  resolved = true;
  return true;
}